

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar5.c
# Opt level: O0

void test_read_format_rar5_nonempty_dir_stream(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a_00;
  archive *a;
  archive_entry *ae;
  uint8_t buf [16];
  
  extract_reference_file("test_read_format_rar5_nonempty_dir_stream.rar");
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ю',(uint)(a_00 != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL"
                   ,(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ю',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ю',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a_00);
  wVar2 = archive_read_open_filename(a_00,"test_read_format_rar5_nonempty_dir_stream.rar",0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ю',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filename(a, \"test_read_format_rar5_nonempty_dir_stream.rar\", 10240)"
                   ,a_00);
  archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  archive_read_data((archive *)a_00,&ae,0x10);
  archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  iVar1 = archive_read_close((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'ї',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a_00);
  iVar1 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'ї',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar5_nonempty_dir_stream)
{
	uint8_t buf[16];

	PROLOGUE("test_read_format_rar5_nonempty_dir_stream.rar");

	/* This archive is invalid. However, processing it shouldn't cause any
	 * errors related to buffer overflows when using -fsanitize. */

	(void) archive_read_next_header(a, &ae);
	(void) archive_read_data(a, buf, sizeof(buf));
	(void) archive_read_next_header(a, &ae);

	EPILOGUE();
}